

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChPlasticityCosserat::ComputeStiffnessMatrixElastoplastic
          (ChPlasticityCosserat *this,ChMatrixNM<double,_6,_6> *K,ChVector<double> *strain_n,
          ChVector<double> *strain_m,ChBeamMaterialInternalData *data)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  double *pdVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  ChVector<double> v;
  ChVector<double> bstress_m;
  ChVector<double> bstress_n;
  ChVector<double> astress_m;
  ChVector<double> astress_n;
  ChVector<double> strain_m_inc;
  ChVector<double> strain_n_inc;
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  b_plastic_data;
  ChVector<double> me_strain_m_new;
  ChVector<double> me_strain_n_new;
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  a_plastic_data;
  
  astress_n.m_data[0] = 0.0;
  astress_n.m_data[1] = 0.0;
  astress_n.m_data[2] = 0.0;
  astress_m.m_data[2] = 0.0;
  astress_m.m_data[0] = 0.0;
  astress_m.m_data[1] = 0.0;
  me_strain_n_new.m_data[2] = 0.0;
  me_strain_n_new.m_data[0] = 0.0;
  me_strain_n_new.m_data[1] = 0.0;
  me_strain_m_new.m_data[2] = 0.0;
  me_strain_m_new.m_data[0] = 0.0;
  me_strain_m_new.m_data[1] = 0.0;
  a_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  a_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  a_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (*this->_vptr_ChPlasticityCosserat[4])(this,1);
  b_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  b_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  b_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*this->_vptr_ChPlasticityCosserat[4])(this,1);
  iVar2 = (*this->_vptr_ChPlasticityCosserat[2])
                    (this,&astress_n,&astress_m,&me_strain_n_new,&me_strain_m_new,
                     ((a_plastic_data.
                       super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                     super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                     .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>.
                     _M_head_impl,strain_n,strain_m,data);
  if ((char)iVar2 == '\0') {
    peVar1 = (this->section->elasticity).
             super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    this_00 = (this->section->elasticity).
              super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_ChElasticityCosserat[3])(peVar1,K,strain_n,strain_m);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  else {
    bstress_n.m_data[0] = 0.0;
    bstress_n.m_data[1] = 0.0;
    lVar6 = 0;
    bstress_n.m_data[2] = 0.0;
    bstress_m.m_data[2] = 0.0;
    bstress_m.m_data[0] = 0.0;
    bstress_m.m_data[1] = 0.0;
    strain_n_inc.m_data[0] = strain_n->m_data[0];
    strain_n_inc.m_data[1] = strain_n->m_data[1];
    strain_n_inc.m_data[2] = strain_n->m_data[2];
    strain_m_inc.m_data[0] = strain_m->m_data[0];
    strain_m_inc.m_data[1] = strain_m->m_data[1];
    strain_m_inc.m_data[2] = strain_m->m_data[2];
    pdVar7 = (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
             array + 0x12;
    pdVar5 = (double *)K;
    do {
      strain_n_inc.m_data[lVar6] = strain_n_inc.m_data[lVar6] + 1e-06;
      (*this->_vptr_ChPlasticityCosserat[2])
                (this,&bstress_n,&bstress_m,&me_strain_n_new,&me_strain_m_new,
                 ((b_plastic_data.
                   super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                 .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>.
                 _M_head_impl,&strain_n_inc,&strain_m_inc,data);
      v.m_data[0] = bstress_n.m_data[0] - astress_n.m_data[0];
      v.m_data[1] = bstress_n.m_data[1] - astress_n.m_data[1];
      v.m_data[2] = bstress_n.m_data[2] - astress_n.m_data[2];
      lVar4 = 0;
      pdVar3 = pdVar5;
      do {
        *pdVar3 = v.m_data[lVar4] * 1000000.0;
        lVar4 = lVar4 + 1;
        pdVar3 = pdVar3 + 6;
      } while (lVar4 != 3);
      v.m_data[0] = bstress_m.m_data[0] - astress_m.m_data[0];
      v.m_data[1] = bstress_m.m_data[1] - astress_m.m_data[1];
      v.m_data[2] = bstress_m.m_data[2] - astress_m.m_data[2];
      lVar4 = 0;
      pdVar3 = pdVar7;
      do {
        *pdVar3 = v.m_data[lVar4] * 1000000.0;
        lVar4 = lVar4 + 1;
        pdVar3 = pdVar3 + 6;
      } while (lVar4 != 3);
      strain_n_inc.m_data[lVar6] = strain_n_inc.m_data[lVar6] + -1e-06;
      lVar6 = lVar6 + 1;
      pdVar5 = pdVar5 + 1;
      pdVar7 = pdVar7 + 1;
    } while (lVar6 != 3);
    pdVar7 = (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
             array + 3;
    pdVar5 = (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
             array + 0x15;
    lVar6 = 0;
    do {
      strain_m_inc.m_data[lVar6] = strain_m_inc.m_data[lVar6] + 1e-06;
      (*this->_vptr_ChPlasticityCosserat[2])
                (this,&bstress_n,&bstress_m,&me_strain_n_new,&me_strain_m_new,
                 ((b_plastic_data.
                   super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                 .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>.
                 _M_head_impl,&strain_n_inc,&strain_m_inc,data);
      v.m_data[0] = bstress_n.m_data[0] - astress_n.m_data[0];
      v.m_data[1] = bstress_n.m_data[1] - astress_n.m_data[1];
      v.m_data[2] = bstress_n.m_data[2] - astress_n.m_data[2];
      lVar4 = 0;
      pdVar3 = pdVar7;
      do {
        *pdVar3 = v.m_data[lVar4] * 1000000.0;
        lVar4 = lVar4 + 1;
        pdVar3 = pdVar3 + 6;
      } while (lVar4 != 3);
      v.m_data[0] = bstress_m.m_data[0] - astress_m.m_data[0];
      v.m_data[1] = bstress_m.m_data[1] - astress_m.m_data[1];
      v.m_data[2] = bstress_m.m_data[2] - astress_m.m_data[2];
      lVar4 = 0;
      pdVar3 = pdVar5;
      do {
        *pdVar3 = v.m_data[lVar4] * 1000000.0;
        lVar4 = lVar4 + 1;
        pdVar3 = pdVar3 + 6;
      } while (lVar4 != 3);
      strain_m_inc.m_data[lVar6] = strain_m_inc.m_data[lVar6] + -1e-06;
      lVar6 = lVar6 + 1;
      pdVar7 = pdVar7 + 1;
      pdVar5 = pdVar5 + 1;
    } while (lVar6 != 3);
  }
  std::
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ::~vector(&b_plastic_data);
  std::
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ::~vector(&a_plastic_data);
  return;
}

Assistant:

void ChPlasticityCosserat::ComputeStiffnessMatrixElastoplastic(ChMatrixNM<double, 6, 6>& K,
                                                               const ChVector<>& strain_n,
                                                               const ChVector<>& strain_m,
                                                               const ChBeamMaterialInternalData& data) {
    ChVector<> astress_n;
    ChVector<> astress_m;
    ChVector<> me_strain_n_new;  // needed only as placeholder
    ChVector<> me_strain_m_new;  // needed only as placeholder

    std::vector<std::unique_ptr<ChBeamMaterialInternalData>> a_plastic_data;
    this->CreatePlasticityData(1, a_plastic_data);
    std::vector<std::unique_ptr<ChBeamMaterialInternalData>> b_plastic_data;
    this->CreatePlasticityData(1, b_plastic_data);

    bool in_plastic = ComputeStressWithReturnMapping(astress_n, astress_m, me_strain_n_new, me_strain_m_new,
                                                     *a_plastic_data[0], strain_n, strain_m, data);

    if (!in_plastic) {
        // if no return mapping is needed at this strain state, just use elastic matrix:
        return this->section->GetElasticity()->ComputeStiffnessMatrix(K, strain_n, strain_m);
    } else {
        // if return mapping is needed at this strain state, compute the elastoplastic stiffness by brute force BDF
        double epsi = 1e-6;
        double invepsi = 1.0 / epsi;
        ChVector<> bstress_n;
        ChVector<> bstress_m;
        ChVector<> strain_n_inc = strain_n;
        ChVector<> strain_m_inc = strain_m;
        for (int i = 0; i < 3; ++i) {
            strain_n_inc[i] += epsi;
            this->ComputeStressWithReturnMapping(bstress_n, bstress_m, me_strain_n_new, me_strain_m_new,
                                                 *b_plastic_data[0], strain_n_inc, strain_m_inc, data);
            K.block(0, i, 3, 1) = (bstress_n - astress_n).eigen() * invepsi;
            K.block(3, i, 3, 1) = (bstress_m - astress_m).eigen() * invepsi;
            strain_n_inc[i] -= epsi;
        }
        for (int i = 0; i < 3; ++i) {
            strain_m_inc[i] += epsi;
            this->ComputeStressWithReturnMapping(bstress_n, bstress_m, me_strain_n_new, me_strain_m_new,
                                                 *b_plastic_data[0], strain_n_inc, strain_m_inc, data);
            K.block(0, i + 3, 3, 1) = (bstress_n - astress_n).eigen() * invepsi;
            K.block(3, i + 3, 3, 1) = (bstress_m - astress_m).eigen() * invepsi;
            strain_m_inc[i] -= epsi;
        }
    }
}